

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O3

void icu_63::locale_available_init(void)

{
  bool bVar1;
  undefined1 auVar2 [16];
  Locale *pLVar3;
  ulong *puVar4;
  size_t in_RSI;
  char *posixID;
  UMemory *this;
  ulong uVar5;
  Locale *this_00;
  ulong uVar6;
  long lVar7;
  
  _load_installedLocales();
  uVar5 = (ulong)_installedLocalesCount;
  availableLocaleListCount = _installedLocalesCount;
  pLVar3 = availableLocaleList;
  if (uVar5 != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    this = (UMemory *)0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xe0),8) == 0) {
      this = (UMemory *)(SUB168(auVar2 * ZEXT816(0xe0),0) | 8);
    }
    puVar4 = (ulong *)UMemory::operator_new__(this,in_RSI);
    if (puVar4 == (ulong *)0x0) {
      pLVar3 = (Locale *)0x0;
    }
    else {
      *puVar4 = uVar5;
      lVar7 = 0;
      this_00 = (Locale *)(puVar4 + 1);
      do {
        Locale::Locale(this_00);
        lVar7 = lVar7 + -0xe0;
        this_00 = this_00 + 1;
        pLVar3 = (Locale *)(puVar4 + 1);
      } while (uVar5 * -0xe0 - lVar7 != 0);
    }
  }
  availableLocaleList = pLVar3;
  if (availableLocaleList == (Locale *)0x0) {
    availableLocaleListCount = 0;
  }
  else {
    uVar5 = (ulong)availableLocaleListCount;
    if (0 < (long)uVar5) {
      lVar7 = uVar5 * 0xe0;
      do {
        uVar6 = uVar5 - 1;
        pLVar3 = availableLocaleList + -1;
        _load_installedLocales();
        if ((long)_installedLocalesCount < (long)uVar6) {
          posixID = (char *)0x0;
        }
        else {
          posixID = _installedLocales[uVar6];
        }
        Locale::setFromPOSIXID((Locale *)(pLVar3->language + lVar7 + -8),posixID);
        bVar1 = 1 < uVar5;
        lVar7 = lVar7 + -0xe0;
        uVar5 = uVar6;
      } while (bVar1);
    }
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_LOCALE_AVAILABLE,locale_available_cleanup);
  return;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uloc_countAvailable()
{
    _load_installedLocales();
    return _installedLocalesCount;
}